

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool anyFeatureDescriptionOfDescription<CoreML::Specification::ModelDescription>
               (ModelDescription *description,
               function<bool_(const_CoreML::Specification::FeatureDescription_&)> *criteria)

{
  int iVar1;
  Rep *pRVar2;
  bool bVar3;
  long lVar4;
  void **ppvVar5;
  bool bVar6;
  
  pRVar2 = (description->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  iVar1 = (description->input_).super_RepeatedPtrFieldBase.current_size_;
  lVar4 = 0;
  while ((long)iVar1 * 8 != lVar4) {
    bVar3 = std::function<bool_(const_CoreML::Specification::FeatureDescription_&)>::operator()
                      (criteria,*(FeatureDescription **)((long)ppvVar5 + lVar4));
    lVar4 = lVar4 + 8;
    if (bVar3) {
      return true;
    }
  }
  pRVar2 = (description->output_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  iVar1 = (description->output_).super_RepeatedPtrFieldBase.current_size_;
  lVar4 = 0;
  do {
    if ((long)iVar1 * 8 == lVar4) {
      pRVar2 = (description->state_).super_RepeatedPtrFieldBase.rep_;
      ppvVar5 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar5 = (void **)0x0;
      }
      iVar1 = (description->state_).super_RepeatedPtrFieldBase.current_size_;
      lVar4 = 0;
      do {
        bVar6 = (long)iVar1 * 8 == lVar4;
        bVar3 = !bVar6;
        if (bVar6) {
          return bVar3;
        }
        bVar6 = std::function<bool_(const_CoreML::Specification::FeatureDescription_&)>::operator()
                          (criteria,*(FeatureDescription **)((long)ppvVar5 + lVar4));
        lVar4 = lVar4 + 8;
      } while (!bVar6);
      return bVar3;
    }
    bVar3 = std::function<bool_(const_CoreML::Specification::FeatureDescription_&)>::operator()
                      (criteria,*(FeatureDescription **)((long)ppvVar5 + lVar4));
    lVar4 = lVar4 + 8;
  } while (!bVar3);
  return true;
}

Assistant:

static bool anyFeatureDescriptionOfDescription(const Description &description,
                                               std::function<bool(const Specification::FeatureDescription& fd)> criteria) {
    for (const auto& fd: description.input()) {
        if (criteria(fd)) {
            return true;
        }
    }

    for (const auto& fd: description.output()) {
        if (criteria(fd)) {
            return true;
        }
    }

    for (const auto& fd: description.state()) {
        if (criteria(fd)) {
            return true;
        }
    }
    return false;
}